

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

void __thiscall Catch::RunContext::populateReaction(RunContext *this,AssertionReaction *reaction)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = (*(((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[6])();
  reaction->shouldDebugBreak = SUB41(iVar3,0);
  bVar1 = aborting(this);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
  }
  reaction->shouldThrow = bVar2;
  return;
}

Assistant:

void RunContext::populateReaction( AssertionReaction& reaction ) {
        reaction.shouldDebugBreak = m_config->shouldDebugBreak();
        reaction.shouldThrow = aborting() || (m_lastAssertionInfo.resultDisposition & ResultDisposition::Normal);
    }